

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchEnumType_Test::TestBody
          (ExtensionDeclarationsTest_MismatchEnumType_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  FileDescriptorProto *proto;
  ExtensionDeclarationsTestParams *in_R8;
  string_view file_text;
  _Head_base<0UL,_absl::lts_20250127::StatusCode,_false> in_stack_fffffffffffffd40;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_2;
  Message local_250;
  void *local_248;
  FileDescriptor *local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_1;
  MockErrorCollector error_collector;
  DescriptorPool pool;
  AssertHelper local_160;
  Message local_158 [4];
  undefined1 local_138 [4];
  char local_134 [4];
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  size_t local_118;
  undefined1 local_110 [8];
  StatusOr<google::protobuf::FileDescriptorProto> file_proto;
  ExtensionDeclarationsTest_MismatchEnumType_Test *this_local;
  
  file_proto.super_StatusOrData<google::protobuf::FileDescriptorProto>.field_1._240_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "\n        name: \"foo.proto\"\n        package: \"ext.test\"\n        message_type {\n          name: \"Foo\"\n          extension_range {\n            start: 4\n            end: 99999\n            options: {\n              declaration: {\n                number: 10\n                full_name: \".ext.test.bar\"\n                type: \".ext.test.Bar\"\n              }\n            }\n          }\n        }\n        enum_type {\n          name: \"Bar\"\n          value: { name: \"BUZ1\" number: 123 }\n        }\n        enum_type {\n          name: \"Abc\"\n          value: { name: \"BUZ2\" number: 456 }\n        }\n        extension { extendee: \"Foo\" name: \"bar\" number: 10 type_name: \"Abc\" }\n      "
            );
  pPVar2 = testing::
           WithParamInterface<google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams>
           ::GetParam();
  file_text._M_str = (char *)pPVar2;
  file_text._M_len = local_118;
  ParameterizeFileProto
            ((StatusOr<google::protobuf::FileDescriptorProto> *)local_110,
             (descriptor_unittest *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,file_text,in_R8);
  StatusIs<absl::lts_20250127::StatusCode,testing::internal::AnythingMatcher>(local_138,0);
  testing::internal::
  MakePredicateFormatterFromMatcher<StatusIsMatcherP2<absl::lts_20250127::StatusCode,testing::internal::AnythingMatcher>>
            ((StatusIsMatcherP2<absl::lts_20250127::StatusCode,_testing::internal::AnythingMatcher>)
             in_stack_fffffffffffffd40._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<StatusIsMatcherP2<absl::lts_20250127::StatusCode,testing::internal::AnythingMatcher>>
  ::operator()(local_130,local_134,(StatusOr<google::protobuf::FileDescriptorProto> *)0x1f32c0e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x329a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (bVar1) {
    DescriptorPool::DescriptorPool
              ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8));
    DescriptorPool::EnforceExtensionDeclarations
              ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8),kAllExtensions);
    MockErrorCollector::MockErrorCollector((MockErrorCollector *)&gtest_ar_1.message_);
    proto = absl::lts_20250127::StatusOr<google::protobuf::FileDescriptorProto>::operator*
                      ((StatusOr<google::protobuf::FileDescriptorProto> *)local_110);
    local_240 = DescriptorPool::BuildFileCollectingErrors
                          ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8),
                           proto,(ErrorCollector *)&gtest_ar_1.message_);
    local_248 = (void *)0x0;
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FileDescriptor_*,_std::nullptr_t,_nullptr>
              ((EqHelper *)local_238,"pool.BuildFileCollectingErrors(*file_proto, &error_collector)"
               ,"nullptr",&local_240,&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x32a0,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_250);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[131],_nullptr>
              ((EqHelper *)local_268,"error_collector.text_",
               "\"foo.proto: ext.test.bar: EXTENDEE: \\\"ext.test.Foo\\\" extension field 10 \" \"is expected to be type \\\".ext.test.Bar\\\", not \\\".ext.test.Abc\\\".\\n\""
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &error_collector,
               (char (*) [131])
               "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension field 10 is expected to be type \".ext.test.Bar\", not \".ext.test.Abc\".\n"
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x32a4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    MockErrorCollector::~MockErrorCollector((MockErrorCollector *)&gtest_ar_1.message_);
    DescriptorPool::~DescriptorPool
              ((DescriptorPool *)((long)&error_collector.warning_text_.field_2 + 8));
  }
  absl::lts_20250127::StatusOr<google::protobuf::FileDescriptorProto>::~StatusOr
            ((StatusOr<google::protobuf::FileDescriptorProto> *)local_110);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchEnumType) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        enum_type {
          name: "Bar"
          value: { name: "BUZ1" number: 123 }
        }
        enum_type {
          name: "Abc"
          value: { name: "BUZ2" number: 456 }
        }
        extension { extendee: "Foo" name: "bar" number: 10 type_name: "Abc" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(
      error_collector.text_,
      "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension field 10 "
      "is expected to be type \".ext.test.Bar\", not \".ext.test.Abc\".\n");
}